

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

_Bool av1_resize_plane_to_half
                (uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2,
                int width2,int out_stride)

{
  _Bool _Var1;
  uint8_t *memblk;
  
  memblk = (uint8_t *)aom_malloc((long)height * (long)width2);
  if (memblk == (uint8_t *)0x0) {
    _Var1 = false;
  }
  else {
    (*av1_resize_horz_dir)(input,in_stride,memblk,height,width,width2);
    _Var1 = (*av1_resize_vert_dir)(memblk,output,out_stride,height,height2,width2,0);
    aom_free(memblk);
  }
  return _Var1;
}

Assistant:

bool av1_resize_plane_to_half(const uint8_t *const input, int height, int width,
                              int in_stride, uint8_t *output, int height2,
                              int width2, int out_stride) {
  uint8_t *intbuf = (uint8_t *)aom_malloc(sizeof(*intbuf) * width2 * height);
  if (intbuf == NULL) {
    return false;
  }

  // Resize in the horizontal direction
  av1_resize_horz_dir(input, in_stride, intbuf, height, width, width2);
  // Resize in the vertical direction
  bool mem_status = av1_resize_vert_dir(intbuf, output, out_stride, height,
                                        height2, width2, 0 /*start_col*/);
  aom_free(intbuf);
  return mem_status;
}